

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::SplitTxOutRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::SplitTxOutRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
          *elements_function)

{
  ErrorResponse local_6b0;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_5f8 [4];
  JsonClassBase<cfd::js::api::json::RawTransactionResponse> local_5d8 [4];
  undefined1 local_5b8 [8];
  RawTransactionResponse res_2;
  RawTransactionResponseStruct local_558;
  RawTransactionResponseStruct local_490;
  undefined1 local_3c8 [8];
  RawTransactionResponseStruct response;
  SplitTxOutRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_a8 [8];
  SplitTxOutRequest req;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
  *elements_function_local;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req.txouts_.super_JsonVector<cfd::js::api::json::SplitTxOutData>.
  super_vector<cfd::js::api::json::SplitTxOutData,_std::allocator<cfd::js::api::json::SplitTxOutData>_>
  .
  super__Vector_base<cfd::js::api::json::SplitTxOutData,_std::allocator<cfd::js::api::json::SplitTxOutData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)elements_function;
  SplitTxOutRequest::SplitTxOutRequest((SplitTxOutRequest *)local_a8);
  core::JsonClassBase<cfd::js::api::json::SplitTxOutRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::SplitTxOutRequest> *)local_a8,request_message);
  SplitTxOutRequest::ConvertToStruct
            ((SplitTxOutRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (SplitTxOutRequest *)local_a8);
  RawTransactionResponseStruct::RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_3c8);
  if ((request._24_1_ & 1) == 0) {
    std::
    function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
    ::operator()(&local_558,bitcoin_function,
                 (SplitTxOutRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    RawTransactionResponseStruct::operator=((RawTransactionResponseStruct *)local_3c8,&local_558);
    RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_558);
  }
  else {
    std::
    function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
    ::operator()(&local_490,elements_function,
                 (SplitTxOutRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    RawTransactionResponseStruct::operator=((RawTransactionResponseStruct *)local_3c8,&local_490);
    RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_490);
  }
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_5b8);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_5b8,(RawTransactionResponseStruct *)local_3c8);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_(local_5d8)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_5d8);
    std::__cxx11::string::~string((string *)local_5d8);
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_5b8);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_6b0,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_5f8);
    std::__cxx11::string::operator=((string *)this,(string *)local_5f8);
    std::__cxx11::string::~string((string *)local_5f8);
    ErrorResponse::~ErrorResponse(&local_6b0);
  }
  res_2._87_1_ = 1;
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_3c8);
  SplitTxOutRequestStruct::~SplitTxOutRequestStruct
            ((SplitTxOutRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  SplitTxOutRequest::~SplitTxOutRequest((SplitTxOutRequest *)local_a8);
  return this;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}